

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O2

int __thiscall Fl_Slider::handle(Fl_Slider *this,int event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (event == 1) {
    iVar4 = Fl::visible_focus();
    if (iVar4 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  iVar4 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
  iVar5 = Fl::box_dx((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar1 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  iVar7 = Fl::box_dw((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  iVar8 = Fl::box_dh((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar4 = handle(this,event,iVar4 + iVar5,iVar1 + iVar6,iVar2 - iVar7,iVar3 - iVar8);
  return iVar4;
}

Assistant:

int Fl_Slider::handle(int event) {
  if (event == FL_PUSH && Fl::visible_focus()) {
    Fl::focus(this);
    redraw();
  }

  return handle(event,
		x()+Fl::box_dx(box()),
		y()+Fl::box_dy(box()),
		w()-Fl::box_dw(box()),
		h()-Fl::box_dh(box()));
}